

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O1

void __thiscall MPL::detail::ModelPackageImpl::validate(ModelPackageImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  path *this_00;
  int iVar2;
  JsonMap *this_01;
  char *pcVar3;
  bool bVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  istream *piVar10;
  int *piVar11;
  long lVar12;
  long lVar13;
  runtime_error *prVar14;
  uint uVar15;
  pointer __rhs;
  uint uVar16;
  string token;
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> itemInfoEntry;
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> itemInfoEntries;
  string versionString;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  versionTokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  identifiers;
  istringstream versionStringStream;
  path local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_300;
  undefined1 local_2f8 [64];
  undefined1 local_2b8 [40];
  string local_290;
  path local_270;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  string local_230;
  path *local_210;
  string local_208;
  string local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  string local_1b0 [3];
  ios_base local_138 [264];
  
  this_01 = (this->m_manifest)._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>.
            _M_t.super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
            super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl;
  local_2f8._56_8_ = this;
  local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"fileFormatVersion","");
  JsonMap::getString((string *)(local_2b8 + 0x28),this_01,local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != &local_1b0[0].field_2) {
    operator_delete(local_1b0[0]._M_dataplus._M_p,local_1b0[0].field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::istringstream::istringstream
            ((istringstream *)local_1b0,(string *)(local_2b8 + 0x28),_S_in);
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &local_328._M_pathname.field_2;
  local_328._M_pathname._M_string_length = 0;
  local_328._M_pathname.field_2._M_local_buf[0] = '\0';
  local_328._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  while (piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_1b0,(string *)&local_328,'.'),
        ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_248,&local_328._M_pathname);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_328._M_pathname._M_dataplus._M_p,
                    CONCAT71(local_328._M_pathname.field_2._M_allocated_capacity._1_7_,
                             local_328._M_pathname.field_2._M_local_buf[0]) + 1);
  }
  if ((long)local_248.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_248.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x60) {
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_328._M_pathname,
                   "File format version must be in the form of major.minor.patch, but the specified value was: "
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_2b8 + 0x28));
    std::runtime_error::runtime_error(prVar14,(string *)&local_328);
    __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar3 = ((local_248.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
  piVar11 = __errno_location();
  iVar2 = *piVar11;
  *piVar11 = 0;
  lVar12 = strtol(pcVar3,(char **)&local_328,10);
  if (local_328._M_pathname._M_dataplus._M_p == pcVar3) {
    std::__throw_invalid_argument("stoi");
LAB_0011f777:
    std::__throw_out_of_range("stoi");
LAB_0011f783:
    std::__throw_invalid_argument("stoi");
LAB_0011f78f:
    std::__throw_out_of_range("stoi");
LAB_0011f79b:
    std::__throw_invalid_argument("stoi");
  }
  else {
    uVar15 = (uint)lVar12;
    if (((int)uVar15 != lVar12) || (*piVar11 == 0x22)) goto LAB_0011f777;
    if (*piVar11 == 0) {
      *piVar11 = iVar2;
    }
    pcVar3 = local_248.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    local_300 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(local_300._4_4_,*piVar11);
    *piVar11 = 0;
    lVar12 = strtol(pcVar3,(char **)&local_328,10);
    if (local_328._M_pathname._M_dataplus._M_p == pcVar3) goto LAB_0011f783;
    if ((lVar12 - 0x80000000U < 0xffffffff00000000) || (*piVar11 == 0x22)) goto LAB_0011f78f;
    if (*piVar11 == 0) {
      *piVar11 = (int)local_300;
    }
    pcVar3 = local_248.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
    local_300 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(local_300._4_4_,*piVar11);
    *piVar11 = 0;
    lVar13 = strtol(pcVar3,(char **)&local_328,10);
    if (local_328._M_pathname._M_dataplus._M_p == pcVar3) goto LAB_0011f79b;
    if ((0xfffffffeffffffff < lVar13 - 0x80000000U) && (*piVar11 != 0x22)) {
      if (*piVar11 == 0) {
        *piVar11 = (int)local_300;
      }
      uVar16 = (uint)lVar12;
      if (-1 < (int)(uVar16 | uVar15 | (uint)lVar13)) {
        if (((1 < (int)uVar15) || ((uVar15 == 1 && (0 < (int)uVar16)))) ||
           ((uVar16 == 0 && (0 < (int)(uint)lVar13)))) {
          prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_328._M_pathname,"Unsupported version: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_2b8 + 0x28));
          std::runtime_error::runtime_error(prVar14,(string *)&local_328);
          __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        getItemInfoEntries((ModelPackageImpl *)local_2b8);
        if ((JsonMap *)local_2b8._0_8_ != (JsonMap *)0x0) {
          local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          JsonMap::getKeys((JsonMap *)local_2b8._0_8_,&local_1c8);
          local_300 = local_1c8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          if (local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            local_2f8._8_8_ = local_2f8 + 0x20;
            local_2f8._48_8_ = local_2b8 + 0x18;
            local_210 = (path *)(local_2f8._56_8_ + 0x50);
            __rhs = local_1c8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
            do {
              getItemInfoEntry((ModelPackageImpl *)local_2f8,(string *)local_2f8._56_8_);
              uVar5 = local_2f8._0_8_;
              local_328._M_pathname._M_dataplus._M_p = (pointer)&local_328._M_pathname.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"path","");
              bVar6 = JsonMap::hasKey((JsonMap *)uVar5,&local_328._M_pathname);
              uVar5 = local_2f8._0_8_;
              bVar8 = true;
              if (bVar6) {
                local_2f8._16_8_ = local_2f8 + 0x20;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)(local_2f8 + 0x10),"name","");
                bVar7 = JsonMap::hasKey((JsonMap *)uVar5,(string *)(local_2f8 + 0x10));
                uVar5 = local_2f8._0_8_;
                if (!bVar7) goto LAB_0011f411;
                local_2b8._8_8_ = local_2b8 + 0x18;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)(local_2b8 + 8),"author","");
                bVar8 = JsonMap::hasKey((JsonMap *)uVar5,(string *)(local_2b8 + 8));
                uVar5 = local_2f8._0_8_;
                if (bVar8) {
                  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_230,"description","");
                  bVar8 = JsonMap::hasKey((JsonMap *)uVar5,&local_230);
                  bVar8 = !bVar8;
                  bVar4 = true;
                  bVar7 = true;
                }
                else {
                  bVar4 = true;
                  bVar7 = false;
                  bVar8 = true;
                }
              }
              else {
LAB_0011f411:
                bVar4 = false;
                bVar7 = false;
              }
              if ((bVar7) &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_230._M_dataplus._M_p != &local_230.field_2)) {
                operator_delete(local_230._M_dataplus._M_p,
                                local_230.field_2._M_allocated_capacity + 1);
              }
              if ((bVar4) && ((undefined1 *)local_2b8._8_8_ != local_2b8 + 0x18)) {
                operator_delete((void *)local_2b8._8_8_,local_2b8._24_8_ + 1);
              }
              if ((bVar6) && ((undefined1 *)local_2f8._16_8_ != local_2f8 + 0x20)) {
                operator_delete((void *)local_2f8._16_8_,local_2f8._32_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_pathname._M_dataplus._M_p != &local_328._M_pathname.field_2) {
                operator_delete(local_328._M_pathname._M_dataplus._M_p,
                                CONCAT71(local_328._M_pathname.field_2._M_allocated_capacity._1_7_,
                                         local_328._M_pathname.field_2._M_local_buf[0]) + 1);
              }
              uVar5 = local_2f8._0_8_;
              if (bVar8) {
                prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::operator+(&local_328._M_pathname,"Invalid itemInfo for identifier: ",__rhs);
                std::runtime_error::runtime_error(prVar14,(string *)&local_328);
                __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"path","");
              JsonMap::getString(&local_1e8,(JsonMap *)uVar5,&local_208);
              this_00 = (path *)(local_2b8 + 0x48);
              std::filesystem::__cxx11::path::path(this_00,&local_1e8,auto_format);
              std::filesystem::__cxx11::operator/(&local_328,local_210,this_00);
              std::filesystem::__cxx11::path::~path(this_00);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208._M_dataplus._M_p != &local_208.field_2) {
                operator_delete(local_208._M_dataplus._M_p,
                                local_208.field_2._M_allocated_capacity + 1);
              }
              cVar9 = std::filesystem::status(&local_328);
              if ((cVar9 == -1) || (cVar9 == '\0')) {
                prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_2b8 + 0x48),"Item does not exist for identifier: ",__rhs);
                std::runtime_error::runtime_error(prVar14,(string *)(local_2b8 + 0x48));
                __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              std::filesystem::__cxx11::path::~path(&local_328);
              std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
                        ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_2f8);
              __rhs = __rhs + 1;
            } while (__rhs != local_300);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1c8);
        }
        std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
                  ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_2b8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_248);
        std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
        std::ios_base::~ios_base(local_138);
        if (local_290._M_dataplus._M_p != local_2b8 + 0x38) {
          operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
        }
        return;
      }
      goto LAB_0011f7b3;
    }
  }
  std::__throw_out_of_range("stoi");
LAB_0011f7b3:
  prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_328._M_pathname,"File format version uses negative number(s): ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_2b8 + 0x28));
  std::runtime_error::runtime_error(prVar14,(string *)&local_328);
  __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ModelPackageImpl::validate()
{
    const std::string versionString = m_manifest->getString(kModelPackageFileFormatVersionKey);

    std::istringstream versionStringStream(versionString);
    std::vector<std::string> versionTokens;
    for (std::string token; std::getline(versionStringStream, token, '.');) {
        versionTokens.push_back(token);
    }

    if (versionTokens.size() != 3) {
        throw std::runtime_error("File format version must be in the form of major.minor.patch, but the specified value was: " + versionString);
    }

    int majorVersion = 0;
    int minorVersion = 0;
    int patchVersion = 0;
    try {
        majorVersion = std::stoi(versionTokens[0]);
        minorVersion = std::stoi(versionTokens[1]);
        patchVersion = std::stoi(versionTokens[2]);
    } catch (std::invalid_argument& e) {
        throw std::runtime_error("Failed to parse file format version: " + versionString + " because: " + e.what());
    }

    if (majorVersion < 0 ||
        minorVersion < 0 ||
        patchVersion < 0 ) {
        throw std::runtime_error("File format version uses negative number(s): " + versionString);
    }

    if ((majorVersion > kModelPackageFileFormatMajorVersion) ||
        (majorVersion == kModelPackageFileFormatMajorVersion && minorVersion > kModelPackageFileFormatMinorVersion) ||
        (minorVersion == kModelPackageFileFormatMinorVersion && patchVersion > kModelPackageFileFormatPatchVersion)) {
        throw std::runtime_error("Unsupported version: " + versionString);
    }
    
    // Validate 1.0.0 model package
    
    auto itemInfoEntries = getItemInfoEntries();
    if (itemInfoEntries != nullptr) {
        std::vector<std::string> identifiers;
        itemInfoEntries->getKeys(identifiers);
        for (const auto& identifier : identifiers) {
            auto itemInfoEntry = getItemInfoEntry(identifier);
            
            if (false == itemInfoEntry->hasKey(kModelPackageItemInfoPathKey) ||
                false == itemInfoEntry->hasKey(kModelPackageItemInfoNameKey) ||
                false == itemInfoEntry->hasKey(kModelPackageItemInfoAuthorKey) ||
                false == itemInfoEntry->hasKey(kModelPackageItemInfoDescriptionKey)) {
                throw std::runtime_error("Invalid itemInfo for identifier: " + identifier);
            }
            
            auto path = m_packageDataDirPath / itemInfoEntry->getString(kModelPackageItemInfoPathKey);
            if (false == exists(path)) {
                throw std::runtime_error("Item does not exist for identifier: " + identifier);
            }
        }
    }
}